

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O3

int cpu_exec_mips64(uc_struct_conflict6 *uc,CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUClass *pCVar3;
  long lVar4;
  void *pvVar5;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var6;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var7;
  vaddr vVar8;
  CPUWatchpoint *pCVar9;
  _Bool _Var10;
  char cVar11;
  int iVar12;
  uint uVar13;
  TranslationBlock *pTVar14;
  ulong uVar15;
  long lVar16;
  TranslationBlock *pTVar17;
  TranslationBlock *pTVar18;
  uint uVar19;
  uint32_t cflags;
  CPUClass *pCVar20;
  TranslationBlock *pTVar21;
  TranslationBlock_conflict *pTVar22;
  uint flags;
  list_item *plVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  target_ulong local_50;
  undefined4 local_48;
  target_ulong local_40;
  undefined4 local_38;
  
  pCVar20 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar20->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar20->has_work)((CPUState_conflict *)cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar20->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar12 != 0) {
    pCVar20 = cpu->cc;
  }
LAB_008857ae:
  puVar1 = cpu->uc;
  uVar13 = cpu->exception_index;
  if (puVar1->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var10 = (*puVar1->stop_interrupt)(puVar1,uVar13);
    if (_Var10) {
      plVar23 = puVar1->hook[0xe].head;
      goto joined_r0x00885e41;
    }
    uVar13 = cpu->exception_index;
  }
  if (-1 < (int)uVar13) {
    if (0xffff < uVar13) {
      if (uVar13 == 0x10002) {
        pCVar3 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          for (pCVar9 = (cpu->watchpoints).tqh_first; pCVar9 != (CPUWatchpoint *)0x0;
              pCVar9 = (pCVar9->entry).tqe_next) {
            *(byte *)&pCVar9->flags = (byte)pCVar9->flags & 0x3f;
          }
        }
        (*pCVar3->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_00885ecc;
    }
    cpu[1].tb_jmp_cache[0x163] = (TranslationBlock *)puVar1->next_pc;
    plVar23 = puVar1->hook[0].head;
    if (plVar23 == (list_item *)0x0) goto LAB_00885e20;
    bVar24 = false;
    do {
      pvVar2 = plVar23->data;
      if (pvVar2 == (void *)0x0) break;
      if (*(char *)((long)pvVar2 + 0x14) == '\0') {
        (**(code **)((long)pvVar2 + 0x28))
                  (puVar1,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
        bVar24 = true;
      }
      plVar23 = plVar23->next;
    } while (plVar23 != (list_item *)0x0);
    if (!bVar24) goto LAB_00885e20;
    cpu->exception_index = -1;
  }
  pTVar18 = (TranslationBlock *)0x0;
  pTVar17 = pTVar18;
  while( true ) {
    pCVar3 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0xa0a) = 0;
    uVar13 = cpu->interrupt_request;
    if (uVar13 != 0) {
      uVar19 = uVar13;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar19 = uVar13 & 0xffffeda5;
      }
      if ((char)uVar19 < '\0') {
        cpu->interrupt_request = uVar13 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_008857ae;
      }
      if ((uVar19 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_008857ae;
      }
      _Var10 = (*pCVar3->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar19);
      if (_Var10) {
        cpu->exception_index = -1;
        pTVar17 = (TranslationBlock *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar17 = (TranslationBlock *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    cflags = cpu->cflags_next_tb;
    if (cflags == 0xffffffff) {
      cflags = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    puVar1 = cpu->uc;
    uVar15 = *(ulong *)((long)cpu->env_ptr + 0x100);
    flags = *(uint *)((long)cpu->env_ptr + 0x3e44) & 0x1fffffff;
    uVar13 = (uint)(uVar15 >> 6) ^ (uint)uVar15;
    uVar13 = uVar13 & 0x3f | uVar13 >> 6 & 0xfc0;
    pTVar14 = cpu->tb_jmp_cache[uVar13];
    uVar19 = cpu->cluster_index << 0x18 | cflags & 0xffffff;
    if ((((pTVar14 == (TranslationBlock *)0x0) || (pTVar14->pc != uVar15)) ||
        (pTVar14->cs_base != 0)) ||
       (((pTVar14->flags != flags || (cpu->trace_dstate[0] != (ulong)pTVar14->trace_vcpu_dstate)) ||
        ((*(uint *)&((tb_tc *)&pTVar14->cflags)->ptr & 0xff0effff) != uVar19)))) {
      pTVar14 = (TranslationBlock *)tb_htable_lookup_mips64(cpu,uVar15,0,flags,uVar19);
      if (pTVar14 == (TranslationBlock *)0x0) {
        pTVar14 = tb_gen_code_mips64(cpu,uVar15,0,flags,cflags);
        cpu->tb_jmp_cache[uVar13] = pTVar14;
        pTVar21 = puVar1->last_tb;
        if (pTVar21 != (TranslationBlock *)0x0) {
          local_40 = pTVar14->pc;
          uVar13._0_2_ = pTVar14->size;
          uVar13._2_2_ = pTVar14->icount;
          auVar25 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0xe1);
          local_38 = auVar25._0_4_;
          local_50 = pTVar21->pc;
          uVar19._0_2_ = pTVar21->size;
          uVar19._2_2_ = pTVar21->icount;
          auVar25 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0xe1);
          local_48 = auVar25._0_4_;
          for (plVar23 = puVar1->hook[0xf].head;
              (plVar23 != (list_item *)0x0 && (pvVar2 = plVar23->data, pvVar2 != (void *)0x0));
              plVar23 = plVar23->next) {
            if (*(char *)((long)pvVar2 + 0x14) == '\0') {
              if ((*(ulong *)((long)pvVar2 + 0x18) <= pTVar14->pc &&
                   pTVar14->pc <= *(ulong *)((long)pvVar2 + 0x20)) ||
                 (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) {
                (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
              }
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar13] = pTVar14;
      }
    }
    if ((pTVar17 != (TranslationBlock *)0x0) && (pTVar14->page_addr[1] == 0xffffffffffffffff)) {
      if (1 < (uint)pTVar18) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if (((ulong)((tb_tc *)&pTVar14->cflags)->ptr & 0x40000) == 0) {
        LOCK();
        bVar24 = pTVar17->jmp_dest[(long)pTVar18] == 0;
        if (bVar24) {
          pTVar17->jmp_dest[(long)pTVar18] = (uintptr_t)pTVar14;
        }
        UNLOCK();
        if (bVar24) {
          pvVar2 = (pTVar17->tc).ptr;
          *(int *)(pTVar17->jmp_target_arg[(long)pTVar18] + (long)pvVar2) =
               (*(int *)&(pTVar14->tc).ptr -
               ((int)pTVar17->jmp_target_arg[(long)pTVar18] + (int)pvVar2)) + -4;
          pTVar17->jmp_list_next[(long)pTVar18] = pTVar14->jmp_list_head;
          pTVar14->jmp_list_head = (ulong)pTVar17 | (ulong)pTVar18;
        }
      }
    }
    if (cpu->exit_request == false) {
      pvVar2 = cpu->env_ptr;
      tb_exec_lock_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
      uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x2e8) + 0x90))(pvVar2);
      if (cpu->uc->nested_level == 1) {
        tb_exec_unlock_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
      }
      cpu->can_do_io = 1;
      pTVar21 = (TranslationBlock *)(uVar15 & 0xfffffffffffffffc);
      if ((uVar15 & 2) != 0) {
        if (*(long *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x358) == 0) {
          uVar13 = *(uint *)(*(long *)((long)pvVar2 + 0x3ef0) + 0x578);
          if (((0x12 < uVar13) || ((0x771c0U >> (uVar13 & 0x1f) & 1) == 0)) &&
             (cpu->uc->quit_request == false)) {
            p_Var6 = cpu->cc->synchronize_from_tb;
            if (p_Var6 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
              p_Var7 = cpu->cc->set_pc;
              if (p_Var7 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00885f1e;
              (*p_Var7)((CPUState_conflict *)cpu,pTVar21->pc);
            }
            else {
              (*p_Var6)((CPUState_conflict *)cpu,(TranslationBlock_conflict *)pTVar21);
            }
          }
        }
        cpu->tcg_exit_req = 0;
      }
      cpu->uc->last_tb = pTVar14;
      uVar13 = (uint)uVar15 & 3;
      pTVar18 = (TranslationBlock *)(ulong)uVar13;
      pTVar17 = pTVar21;
      if (uVar13 == 3) {
        pTVar17 = (TranslationBlock *)0x0;
        pTVar18 = (TranslationBlock *)0x3;
        if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x141)) {
          lVar4 = cpu->icount_budget;
          lVar16 = 0xffff;
          if (lVar4 < 0xffff) {
            lVar16 = lVar4;
          }
          uVar13 = (uint)lVar16;
          *(short *)(cpu[1].tb_jmp_cache + 0x141) = (short)lVar16;
          cpu->icount_extra = lVar4 - (int)uVar13;
          pTVar17 = (TranslationBlock *)0x0;
          pTVar18 = (TranslationBlock *)0x3;
          if (0 < (int)uVar13 && lVar4 - (int)uVar13 == 0) {
            uVar19 = 0x7fff;
            if (uVar13 < 0x7fff) {
              uVar19 = uVar13;
            }
            pTVar17 = tb_gen_code_mips64(cpu,pTVar21->pc,pTVar21->cs_base,pTVar21->flags,
                                         uVar19 | 0x10000);
            pTVar17->orig_tb = pTVar21;
            pvVar2 = (pTVar17->tc).ptr;
            pvVar5 = cpu->env_ptr;
            tb_exec_lock_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
            uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar5 + 0x3ef0) + 0x2e8) + 0x90))
                               (pvVar5,pvVar2);
            if (cpu->uc->nested_level == 1) {
              tb_exec_unlock_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
            }
            cpu->can_do_io = 1;
            if ((uVar15 & 2) != 0) {
              if (*(long *)(*(long *)((long)pvVar5 + 0x3ef0) + 0x358) == 0) {
                uVar13 = *(uint *)(*(long *)((long)pvVar5 + 0x3ef0) + 0x578);
                if (((0x12 < uVar13) || ((0x771c0U >> (uVar13 & 0x1f) & 1) == 0)) &&
                   (cpu->uc->quit_request == false)) {
                  pTVar22 = (TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc);
                  p_Var6 = cpu->cc->synchronize_from_tb;
                  if (p_Var6 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                    p_Var7 = cpu->cc->set_pc;
                    if (p_Var7 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00885f1e:
                      __assert_fail("cc->set_pc",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                    ,0x61,
                                    "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
                    }
                    vVar8._0_4_ = pTVar22->pc;
                    vVar8._4_4_ = pTVar22->cs_base;
                    (*p_Var7)((CPUState_conflict *)cpu,vVar8);
                  }
                  else {
                    (*p_Var6)((CPUState_conflict *)cpu,pTVar22);
                  }
                }
              }
              cpu->tcg_exit_req = 0;
            }
            tb_phys_invalidate_mips64
                      ((TCGContext_conflict5 *)cpu->uc->tcg_ctx,pTVar17,0xffffffffffffffff);
            tcg_tb_remove_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx,pTVar17);
            pTVar17 = (TranslationBlock *)0x0;
            pTVar18 = (TranslationBlock *)0x3;
          }
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_008857ae;
joined_r0x00885e41:
  if ((plVar23 == (list_item *)0x0) || (pvVar2 = plVar23->data, pvVar2 == (void *)0x0))
  goto LAB_00885e6b;
  if ((*(char *)((long)pvVar2 + 0x14) == '\0') &&
     (cVar11 = (**(code **)((long)pvVar2 + 0x28))(puVar1,*(undefined8 *)((long)pvVar2 + 0x30)),
     cVar11 != '\0')) goto LAB_00885e76;
  plVar23 = plVar23->next;
  goto joined_r0x00885e41;
LAB_00885e6b:
  puVar1->invalid_error = 10;
  goto LAB_00885e76;
LAB_00885e20:
  puVar1->invalid_error = 0x15;
  cpu->halted = 1;
LAB_00885e76:
  uVar13 = 0x10001;
LAB_00885ecc:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar20->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar13;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}